

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::~ColladaExporter(ColladaExporter *this)

{
  aiScene *this_00;
  pointer pcVar1;
  
  this->_vptr_ColladaExporter = (_func_int **)&PTR__ColladaExporter_007fc6a0;
  if (this->mSceneOwned == true) {
    this_00 = this->mScene;
    if (this_00 != (aiScene *)0x0) {
      aiScene::~aiScene(this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->textures)._M_t);
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::~vector(&this->materials);
  pcVar1 = (this->endstr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->endstr).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->startstr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->startstr).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mFile)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mFile).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mPath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mPath).field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->mOutput);
  std::ios_base::~ios_base((ios_base *)&this->field_0xa8);
  pcVar1 = (this->mFoundSkeletonRootNodeID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mFoundSkeletonRootNodeID).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ColladaExporter::~ColladaExporter() {
    if ( mSceneOwned ) {
        delete mScene;
    }
}